

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O0

void * pack_thread(void *pargs)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ssize_t sVar3;
  ssize_t wr;
  ssize_t rd;
  char local_9b8 [4];
  int fd;
  char parent_file [1024];
  char host [1024];
  char parent [256];
  stat st;
  dirent *dent;
  DIR *dir;
  args_t *args;
  void *pargs_local;
  
  __dirp = opendir(*(char **)((long)pargs + 0x38));
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"cannot open %s\n",*(undefined8 *)((long)pargs + 0x38));
  }
  else {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      iVar1 = strcmp(pdVar2->d_name,".");
      if ((iVar1 != 0) && (iVar1 = strcmp(pdVar2->d_name,".."), iVar1 != 0)) {
        snprintf(parent_file + 0x3f8,0x400,"%s/%s",*(undefined8 *)((long)pargs + 0x38),
                 pdVar2->d_name);
        iVar1 = stat(parent_file + 0x3f8,(stat *)(parent + 0xf8));
        if (iVar1 < 0) {
          fprintf(_stderr,"internal error\n");
          break;
        }
        if (((uint)st.st_nlink & 0xf000) == 0x4000) {
          snprintf(local_9b8,0x400,"%s/%s",parent_file + 0x3f8,"VITA_PATH.TXT");
          iVar1 = open(local_9b8,0);
          if (iVar1 < 0) {
            fprintf(_stderr,"WARNING: skipping %s because VITA_PATH.TXT is not found!\n",
                    parent_file + 0x3f8);
          }
          else {
            sVar3 = read_block(iVar1,host + 0x3f8,0xff);
            if (sVar3 < 0) {
              fprintf(_stderr,"error reading %s\n",local_9b8);
              break;
            }
            close(iVar1);
            host[sVar3 + 0x3f8] = '\0';
            printf("adding files for %s\n",host + 0x3f8);
            sVar3 = add_all_files(*(int *)((long)pargs + 4),host + 0x3f8,"",parent_file + 0x3f8);
            if (sVar3 < 0) break;
            *(ssize_t *)((long)pargs + 0x40) = sVar3 + *(long *)((long)pargs + 0x40);
          }
        }
        else {
          fprintf(_stderr,"WARNING: skipping %s because it is not a directory!\n",
                  parent_file + 0x3f8);
        }
      }
    }
    closedir(__dirp);
  }
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *pack_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  DIR *dir;
  struct dirent *dent;
  struct stat st;
  char parent[256];
  char host[MAX_PATH_LEN];
  char parent_file[MAX_PATH_LEN];
  int fd;
  ssize_t rd, wr;
  
  if ((dir = opendir(args->prefix)) == NULL) {
    fprintf(stderr, "cannot open %s\n", args->prefix);
    goto end2;
  }

  while ((dent = readdir(dir)) != NULL) {
    if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
      continue;
    }

#ifdef __APPLE__
    if (strcmp(dent->d_name, ".DS_Store") == 0) {
      continue; // ignore annoying OSX specific files
    }
#endif

    snprintf(host, sizeof(host), "%s/%s", args->prefix, dent->d_name);
    if (stat(host, &st) < 0) {
      fprintf(stderr, "internal error\n");
      goto end;
    }

    if (S_ISDIR(st.st_mode)) {
      snprintf(parent_file, sizeof(parent_file), "%s/%s", host, "VITA_PATH.TXT");
      if ((fd = open(parent_file, O_RDONLY | O_BINARY)) < 0) {
        fprintf(stderr, "WARNING: skipping %s because VITA_PATH.TXT is not found!\n", host);
        continue;
      }
      if ((rd = read_block(fd, parent, sizeof(parent)-1)) < 0) {
        fprintf(stderr, "error reading %s\n", parent_file);
        goto end;
      }
      close(fd);
      parent[rd] = '\0';
      dent = NULL; // so we don't actually reuse it
      printf("adding files for %s\n", parent);
      if ((wr = add_all_files(args->out, parent, "\0", host)) < 0) {
        goto end;
      }
      args->content_size += wr;
    } else {
      fprintf(stderr, "WARNING: skipping %s because it is not a directory!\n", host);
    }
  }
  
end:
  closedir(dir);
end2:
  close(args->out);
  close(args->in);
  return NULL;
}